

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateFactorDiscrete.cpp
# Opt level: O1

string * __thiscall
StateFactorDiscrete::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,StateFactorDiscrete *this)

{
  pointer pcVar1;
  pointer pbVar2;
  ostream *poVar3;
  pointer pbVar4;
  stringstream ss;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"SF \'",4);
  pcVar1 = (this->super_NamedDescribedEntity)._m_name._M_dataplus._M_p;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar1,
             pcVar1 + (this->super_NamedDescribedEntity)._m_name._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1d8,local_1d0)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' (",3);
  pcVar1 = (this->super_NamedDescribedEntity)._m_description._M_dataplus._M_p;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar1,
             pcVar1 + (this->super_NamedDescribedEntity)._m_description._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1f8,local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"), values: {",0xc);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  pbVar2 = (this->_m_domainValues).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->_m_domainValues).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1) {
    if (pbVar4 != (this->_m_domainValues).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string StateFactorDiscrete::SoftPrint() const
{
    stringstream ss;

    ss << "SF '"<< GetName() << "' ("<<GetDescription()<<"), values: {";
    vector<string>::const_iterator it = _m_domainValues.begin();
    vector<string>::const_iterator last = _m_domainValues.end();
    while(it != last)
    {
        if(it != _m_domainValues.begin() )
            ss << ", ";
        ss << *it;
        it++;
    }
    ss << "}";
    return(ss.str() );
}